

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  ScriptModuleType SVar1;
  Command *pCVar2;
  WastParseOptions *pWVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var10;
  ScriptModuleType SVar11;
  CommandPtr *pCVar12;
  Module *pMVar13;
  Result RVar14;
  Command *pCVar15;
  char *__function;
  Index IVar16;
  Enum EVar17;
  ReadBinaryOptions *this_00;
  Error *error_1;
  Module *this_01;
  long lVar18;
  Error *error;
  _Head_base<0UL,_wabt::Module_*,_false> _Var19;
  string_view filename;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> m;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_98;
  Script *local_90;
  CommandPtr *local_88;
  Enum local_7c;
  undefined1 local_78 [8];
  Module *pMStack_70;
  pointer local_68;
  WastLexer *local_60;
  ReadBinaryOptions local_58;
  
  local_98._M_head_impl = (ScriptModule *)0x0;
  RVar14 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_98);
  _Var10._M_head_impl = local_98._M_head_impl;
  EVar17 = Error;
  if (RVar14.enum_ == Error) goto LAB_0018542d;
  SVar1 = (local_98._M_head_impl)->type_;
  this_01 = (Module *)0x0;
  if (SVar1 == Quoted) {
    local_90 = script;
    local_88 = out_command;
    pCVar15 = (Command *)operator_new(0x3d0);
    memset(pCVar15,0,0x3d0);
    pCVar15->type = First;
    pCVar15->_vptr_Command = (_func_int **)&PTR__ModuleCommand_002464a8;
    pCVar15[1]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[1].type = 0;
    *(undefined8 *)&pCVar15[1].field_0xc = 0;
    *(undefined8 *)((long)&pCVar15[2]._vptr_Command + 4) = 0;
    pCVar15[3]._vptr_Command = (_func_int **)(pCVar15 + 4);
    *(undefined8 *)&pCVar15[3].type = 0;
    *(undefined1 *)&pCVar15[4]._vptr_Command = 0;
    pCVar15[5]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[5].type = 0;
    pCVar15[6]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[6].type = 0;
    *(undefined8 *)&pCVar15[6].field_0xc = 0;
    *(undefined8 *)((long)&pCVar15[7]._vptr_Command + 4) = 0;
    memset(pCVar15 + 8,0,0x120);
    pCVar15[0x1a]._vptr_Command = (_func_int **)(pCVar15 + 0x1d);
    *(undefined8 *)&pCVar15[0x1a].type = 1;
    pCVar15[0x1b]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x1b].type = 0;
    *(undefined4 *)&pCVar15[0x1c]._vptr_Command = 0x3f800000;
    *(undefined8 *)&pCVar15[0x1c].type = 0;
    pCVar15[0x1d]._vptr_Command = (_func_int **)0x0;
    *(CommandType **)&pCVar15[0x1d].type = &pCVar15[0x20].type;
    pCVar15[0x1e]._vptr_Command = (_func_int **)0x1;
    *(undefined8 *)&pCVar15[0x1e].type = 0;
    pCVar15[0x1f]._vptr_Command = (_func_int **)0x0;
    pCVar15[0x1f].type = 0x3f800000;
    pCVar15[0x20]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x20].type = 0;
    pCVar15[0x21]._vptr_Command = (_func_int **)(pCVar15 + 0x24);
    *(undefined8 *)&pCVar15[0x21].type = 1;
    pCVar15[0x22]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x22].type = 0;
    *(undefined4 *)&pCVar15[0x23]._vptr_Command = 0x3f800000;
    *(undefined8 *)&pCVar15[0x23].type = 0;
    pCVar15[0x24]._vptr_Command = (_func_int **)0x0;
    *(CommandType **)&pCVar15[0x24].type = &pCVar15[0x27].type;
    pCVar15[0x25]._vptr_Command = (_func_int **)0x1;
    *(undefined8 *)&pCVar15[0x25].type = 0;
    pCVar15[0x26]._vptr_Command = (_func_int **)0x0;
    pCVar15[0x26].type = 0x3f800000;
    pCVar15[0x27]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x27].type = 0;
    pCVar15[0x28]._vptr_Command = (_func_int **)(pCVar15 + 0x2b);
    *(undefined8 *)&pCVar15[0x28].type = 1;
    pCVar15[0x29]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x29].type = 0;
    *(undefined4 *)&pCVar15[0x2a]._vptr_Command = 0x3f800000;
    *(undefined8 *)&pCVar15[0x2a].type = 0;
    pCVar15[0x2b]._vptr_Command = (_func_int **)0x0;
    *(CommandType **)&pCVar15[0x2b].type = &pCVar15[0x2e].type;
    pCVar15[0x2c]._vptr_Command = (_func_int **)0x1;
    *(undefined8 *)&pCVar15[0x2c].type = 0;
    pCVar15[0x2d]._vptr_Command = (_func_int **)0x0;
    pCVar15[0x2d].type = 0x3f800000;
    pCVar15[0x2e]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x2e].type = 0;
    pCVar15[0x2f]._vptr_Command = (_func_int **)(pCVar15 + 0x32);
    *(undefined8 *)&pCVar15[0x2f].type = 1;
    pCVar15[0x30]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x30].type = 0;
    *(undefined4 *)&pCVar15[0x31]._vptr_Command = 0x3f800000;
    *(undefined8 *)&pCVar15[0x31].type = 0;
    pCVar15[0x32]._vptr_Command = (_func_int **)0x0;
    *(CommandType **)&pCVar15[0x32].type = &pCVar15[0x35].type;
    pCVar15[0x33]._vptr_Command = (_func_int **)0x1;
    *(undefined8 *)&pCVar15[0x33].type = 0;
    pCVar15[0x34]._vptr_Command = (_func_int **)0x0;
    pCVar15[0x34].type = 0x3f800000;
    pCVar15[0x35]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x35].type = 0;
    pCVar15[0x36]._vptr_Command = (_func_int **)(pCVar15 + 0x39);
    *(undefined8 *)&pCVar15[0x36].type = 1;
    pCVar15[0x37]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar15[0x37].type = 0;
    *(undefined4 *)&pCVar15[0x38]._vptr_Command = 0x3f800000;
    pCVar15[0x3a].type = First;
    pCVar15[0x3b]._vptr_Command = (_func_int **)0x0;
    *(undefined4 *)((long)&pCVar15[0x39]._vptr_Command + 7) = 0;
    *(undefined8 *)&pCVar15[0x38].type = 0;
    pCVar15[0x39]._vptr_Command = (_func_int **)0x0;
    *(CommandType **)&pCVar15[0x3b].type = &pCVar15[0x3a].type;
    pCVar15[0x3c]._vptr_Command = (_func_int **)&pCVar15[0x3a].type;
    *(undefined8 *)&pCVar15[0x3c].type = 0;
    if ((_Var10._M_head_impl)->type_ != Quoted) {
      __function = 
      "Derived *wabt::cast(Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Quoted>, Base = wabt::ScriptModule]"
      ;
LAB_00185494:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,__function);
    }
    local_58.features.exceptions_enabled_ = false;
    local_58.features.mutable_globals_enabled_ = false;
    local_58.features.sat_float_to_int_enabled_ = false;
    local_58.features.sign_extension_enabled_ = false;
    local_58.features.simd_enabled_ = false;
    local_58.features.threads_enabled_ = false;
    local_58.features.function_references_enabled_ = false;
    local_58.features.multi_value_enabled_ = false;
    local_58.features.tail_call_enabled_ = false;
    local_58.features.bulk_memory_enabled_ = false;
    local_58.features.reference_types_enabled_ = false;
    local_58.features.annotations_enabled_ = false;
    local_58.features.code_metadata_enabled_ = false;
    local_58.features.gc_enabled_ = false;
    local_58.features.memory64_enabled_ = false;
    local_58.features.multi_memory_enabled_ = false;
    local_58.features.extended_const_enabled_ = false;
    local_58.features.relaxed_simd_enabled_ = false;
    local_58.features.custom_page_sizes_enabled_ = false;
    local_58._19_1_ = 0;
    local_58._20_4_ = 0;
    local_78 = (undefined1  [8])0x0;
    filename._M_str = (char *)0x6;
    filename._M_len = (size_t)&local_60;
    WastLexer::CreateBufferLexer
              (filename,"<text>",(size_t)_Var10._M_head_impl[5]._vptr_ScriptModule,
               (Errors *)
               (*(long *)&_Var10._M_head_impl[5].type_ -
               (long)_Var10._M_head_impl[5]._vptr_ScriptModule));
    local_7c = (Enum)ParseWatModule(local_60,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>
                                              *)local_78,(Errors *)&local_58,this->options_);
    pCVar12 = local_88;
    lVar9 = CONCAT17(local_58.features.multi_memory_enabled_,
                     CONCAT43(local_58.features._11_4_,
                              CONCAT21(local_58.features._9_2_,local_58.features.tail_call_enabled_)
                             ));
    for (lVar18 = CONCAT44(local_58.features._4_4_,local_58.features._0_4_); lVar18 != lVar9;
        lVar18 = lVar18 + 0x48) {
      if (*(long *)(lVar18 + 0x18) == -1) {
        Error(this,0x1ee09d,*(char **)(lVar18 + 0x28));
      }
      else {
        Error(this,0x1ee0b8,*(char **)(lVar18 + 0x18),*(undefined8 *)(lVar18 + 0x28));
      }
    }
    this_01 = (Module *)(pCVar15 + 1);
    if (local_7c == Ok) {
      Module::operator=(this_01,(Module *)local_78);
    }
    script = local_90;
    pCVar2 = (pCVar12->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (pCVar12->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar15;
    if (pCVar2 != (Command *)0x0) {
      (*pCVar2->_vptr_Command[1])();
    }
    if (local_60 != (WastLexer *)0x0) {
      std::default_delete<wabt::WastLexer>::operator()
                ((default_delete<wabt::WastLexer> *)&local_60,local_60);
    }
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
              ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)local_78);
    this_00 = &local_58;
LAB_001853dc:
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)this_00);
  }
  else {
    if (SVar1 == Binary) {
      local_88 = out_command;
      pCVar15 = (Command *)operator_new(0x3d8);
      memset(pCVar15,0,0x3d8);
      pCVar15->type = ScriptModule;
      pCVar15->_vptr_Command = (_func_int **)&PTR__ScriptModuleCommand_002467c8;
      pCVar15[1]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[1].type = 0;
      *(undefined8 *)&pCVar15[1].field_0xc = 0;
      *(undefined8 *)((long)&pCVar15[2]._vptr_Command + 4) = 0;
      pCVar15[3]._vptr_Command = (_func_int **)(pCVar15 + 4);
      *(undefined8 *)&pCVar15[3].type = 0;
      *(undefined1 *)&pCVar15[4]._vptr_Command = 0;
      pCVar15[5]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[5].type = 0;
      pCVar15[6]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[6].type = 0;
      *(undefined8 *)&pCVar15[6].field_0xc = 0;
      *(undefined8 *)((long)&pCVar15[7]._vptr_Command + 4) = 0;
      memset(pCVar15 + 8,0,0x120);
      pCVar15[0x1a]._vptr_Command = (_func_int **)(pCVar15 + 0x1d);
      *(undefined8 *)&pCVar15[0x1a].type = 1;
      pCVar15[0x1b]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x1b].type = 0;
      *(undefined4 *)&pCVar15[0x1c]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x1c].type = 0;
      pCVar15[0x1d]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x1d].type = &pCVar15[0x20].type;
      pCVar15[0x1e]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x1e].type = 0;
      pCVar15[0x1f]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x1f].type = 0x3f800000;
      pCVar15[0x20]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x20].type = 0;
      pCVar15[0x21]._vptr_Command = (_func_int **)(pCVar15 + 0x24);
      *(undefined8 *)&pCVar15[0x21].type = 1;
      pCVar15[0x22]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x22].type = 0;
      *(undefined4 *)&pCVar15[0x23]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x23].type = 0;
      pCVar15[0x24]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x24].type = &pCVar15[0x27].type;
      pCVar15[0x25]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x25].type = 0;
      pCVar15[0x26]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x26].type = 0x3f800000;
      pCVar15[0x27]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x27].type = 0;
      pCVar15[0x28]._vptr_Command = (_func_int **)(pCVar15 + 0x2b);
      *(undefined8 *)&pCVar15[0x28].type = 1;
      pCVar15[0x29]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x29].type = 0;
      *(undefined4 *)&pCVar15[0x2a]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x2a].type = 0;
      pCVar15[0x2b]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x2b].type = &pCVar15[0x2e].type;
      pCVar15[0x2c]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x2c].type = 0;
      pCVar15[0x2d]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x2d].type = 0x3f800000;
      pCVar15[0x2e]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x2e].type = 0;
      pCVar15[0x2f]._vptr_Command = (_func_int **)(pCVar15 + 0x32);
      *(undefined8 *)&pCVar15[0x2f].type = 1;
      pCVar15[0x30]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x30].type = 0;
      *(undefined4 *)&pCVar15[0x31]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x31].type = 0;
      pCVar15[0x32]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x32].type = &pCVar15[0x35].type;
      pCVar15[0x33]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x33].type = 0;
      pCVar15[0x34]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x34].type = 0x3f800000;
      pCVar15[0x35]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x35].type = 0;
      pCVar15[0x36]._vptr_Command = (_func_int **)(pCVar15 + 0x39);
      *(undefined8 *)&pCVar15[0x36].type = 1;
      pCVar15[0x37]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x37].type = 0;
      *(undefined4 *)&pCVar15[0x38]._vptr_Command = 0x3f800000;
      pCVar15[0x3a].type = First;
      pCVar15[0x3b]._vptr_Command = (_func_int **)0x0;
      *(undefined4 *)((long)&pCVar15[0x39]._vptr_Command + 7) = 0;
      *(undefined8 *)&pCVar15[0x38].type = 0;
      pCVar15[0x39]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x3b].type = &pCVar15[0x3a].type;
      pCVar15[0x3c]._vptr_Command = (_func_int **)&pCVar15[0x3a].type;
      *(undefined8 *)&pCVar15[0x3c].type = 0;
      pCVar15[0x3d]._vptr_Command = (_func_int **)0x0;
      if ((_Var10._M_head_impl)->type_ != Binary) {
        __function = 
        "Derived *wabt::cast(Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Binary>, Base = wabt::ScriptModule]"
        ;
        goto LAB_00185494;
      }
      this_01 = (Module *)(pCVar15 + 1);
      local_58.log_stream = (Stream *)0x0;
      local_58.read_debug_names = false;
      local_58.stop_on_first_error = true;
      local_58.fail_on_custom_section_error = true;
      local_58.skip_function_bodies = false;
      pWVar3 = this->options_;
      uVar8 = *(undefined8 *)(pWVar3 + 8);
      local_58.features._0_4_ = SUB84(*(undefined8 *)pWVar3,0);
      local_58.features._4_4_ = SUB84((ulong)*(undefined8 *)pWVar3 >> 0x20,0);
      local_58.features.tail_call_enabled_ = SUB81(uVar8,0);
      local_58.features._9_2_ = SUB82((ulong)uVar8 >> 8,0);
      local_58.features._11_4_ = SUB84((ulong)uVar8 >> 0x18,0);
      local_58.features._16_3_ = SUB43((uint)*(undefined4 *)(pWVar3 + 0xf) >> 8,0);
      local_58.features.multi_memory_enabled_ = SUB81((ulong)uVar8 >> 0x38,0);
      local_68 = (pointer)0x0;
      local_78 = (undefined1  [8])0x0;
      pMStack_70 = (Module *)0x0;
      local_90 = script;
      if (pWVar3[0x14] == (WastParseOptions)0x1) {
        ReadBinaryIr("<text>",_Var10._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&_Var10._M_head_impl[5].type_ -
                     (long)_Var10._M_head_impl[5]._vptr_ScriptModule,&local_58,(Errors *)local_78,
                     this_01);
      }
      std::__cxx11::string::_M_assign((string *)(pCVar15 + 3));
      pMVar13 = pMStack_70;
      pp_Var4 = _Var10._M_head_impl[1]._vptr_ScriptModule;
      SVar11 = _Var10._M_head_impl[1].type_;
      uVar6 = *(undefined4 *)&_Var10._M_head_impl[1].field_0xc;
      SVar1 = _Var10._M_head_impl[2].type_;
      uVar5 = *(undefined4 *)&_Var10._M_head_impl[2].field_0xc;
      pCVar15[2]._vptr_Command = _Var10._M_head_impl[2]._vptr_ScriptModule;
      pCVar15[2].type = SVar1;
      *(undefined4 *)&pCVar15[2].field_0xc = uVar5;
      (this_01->loc).filename._M_len = (size_t)pp_Var4;
      pCVar15[1].type = SVar11;
      *(undefined4 *)&pCVar15[1].field_0xc = uVar6;
      _Var10._M_head_impl = local_98._M_head_impl;
      for (_Var19._M_head_impl = (Module *)local_78; _Var19._M_head_impl != pMVar13;
          _Var19._M_head_impl = (Module *)&((_Var19._M_head_impl)->fields).last_) {
        local_98._M_head_impl = _Var10._M_head_impl;
        if (*(long *)((long)&((_Var19._M_head_impl)->loc).field_1 + 8) == -1) {
          Error(this,0x1ee05d,(char *)((_Var19._M_head_impl)->name)._M_string_length);
        }
        else {
          Error(this,0x1ee078,*(char **)((long)&((_Var19._M_head_impl)->loc).field_1 + 8),
                ((_Var19._M_head_impl)->name)._M_string_length);
        }
        _Var10._M_head_impl = local_98._M_head_impl;
      }
      local_98._M_head_impl = (ScriptModule *)0x0;
      pp_Var4 = pCVar15[0x3d]._vptr_Command;
      pCVar15[0x3d]._vptr_Command = (_func_int **)_Var10._M_head_impl;
      if (pp_Var4 != (_func_int **)0x0) {
        (**(code **)(*pp_Var4 + 8))();
      }
      script = local_90;
      pCVar2 = (local_88->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (local_88->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar15;
      if (pCVar2 != (Command *)0x0) {
        (*pCVar2->_vptr_Command[1])();
      }
      this_00 = (ReadBinaryOptions *)local_78;
      goto LAB_001853dc;
    }
    if (SVar1 == Text) {
      pCVar15 = (Command *)operator_new(0x3d0);
      memset(pCVar15,0,0x3d0);
      pCVar15->type = First;
      pCVar15->_vptr_Command = (_func_int **)&PTR__ModuleCommand_002464a8;
      pCVar15[1]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[1].type = 0;
      *(undefined8 *)&pCVar15[1].field_0xc = 0;
      *(undefined8 *)((long)&pCVar15[2]._vptr_Command + 4) = 0;
      pCVar15[3]._vptr_Command = (_func_int **)(pCVar15 + 4);
      *(undefined8 *)&pCVar15[3].type = 0;
      *(undefined1 *)&pCVar15[4]._vptr_Command = 0;
      pCVar15[5]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[5].type = 0;
      pCVar15[6]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[6].type = 0;
      *(undefined8 *)&pCVar15[6].field_0xc = 0;
      *(undefined8 *)((long)&pCVar15[7]._vptr_Command + 4) = 0;
      memset(pCVar15 + 8,0,0x120);
      pCVar15[0x1a]._vptr_Command = (_func_int **)(pCVar15 + 0x1d);
      *(undefined8 *)&pCVar15[0x1a].type = 1;
      pCVar15[0x1b]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x1b].type = 0;
      *(undefined4 *)&pCVar15[0x1c]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x1c].type = 0;
      pCVar15[0x1d]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x1d].type = &pCVar15[0x20].type;
      pCVar15[0x1e]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x1e].type = 0;
      pCVar15[0x1f]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x1f].type = 0x3f800000;
      pCVar15[0x20]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x20].type = 0;
      pCVar15[0x21]._vptr_Command = (_func_int **)(pCVar15 + 0x24);
      *(undefined8 *)&pCVar15[0x21].type = 1;
      pCVar15[0x22]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x22].type = 0;
      *(undefined4 *)&pCVar15[0x23]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x23].type = 0;
      pCVar15[0x24]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x24].type = &pCVar15[0x27].type;
      pCVar15[0x25]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x25].type = 0;
      pCVar15[0x26]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x26].type = 0x3f800000;
      pCVar15[0x27]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x27].type = 0;
      pCVar15[0x28]._vptr_Command = (_func_int **)(pCVar15 + 0x2b);
      *(undefined8 *)&pCVar15[0x28].type = 1;
      pCVar15[0x29]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x29].type = 0;
      *(undefined4 *)&pCVar15[0x2a]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x2a].type = 0;
      pCVar15[0x2b]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x2b].type = &pCVar15[0x2e].type;
      pCVar15[0x2c]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x2c].type = 0;
      pCVar15[0x2d]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x2d].type = 0x3f800000;
      pCVar15[0x2e]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x2e].type = 0;
      pCVar15[0x2f]._vptr_Command = (_func_int **)(pCVar15 + 0x32);
      *(undefined8 *)&pCVar15[0x2f].type = 1;
      pCVar15[0x30]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x30].type = 0;
      *(undefined4 *)&pCVar15[0x31]._vptr_Command = 0x3f800000;
      *(undefined8 *)&pCVar15[0x31].type = 0;
      pCVar15[0x32]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x32].type = &pCVar15[0x35].type;
      pCVar15[0x33]._vptr_Command = (_func_int **)0x1;
      *(undefined8 *)&pCVar15[0x33].type = 0;
      pCVar15[0x34]._vptr_Command = (_func_int **)0x0;
      pCVar15[0x34].type = 0x3f800000;
      pCVar15[0x35]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x35].type = 0;
      pCVar15[0x36]._vptr_Command = (_func_int **)(pCVar15 + 0x39);
      *(undefined8 *)&pCVar15[0x36].type = 1;
      pCVar15[0x37]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar15[0x37].type = 0;
      *(undefined4 *)&pCVar15[0x38]._vptr_Command = 0x3f800000;
      pCVar15[0x3a].type = First;
      pCVar15[0x3b]._vptr_Command = (_func_int **)0x0;
      *(undefined4 *)((long)&pCVar15[0x39]._vptr_Command + 7) = 0;
      *(undefined8 *)&pCVar15[0x38].type = 0;
      pCVar15[0x39]._vptr_Command = (_func_int **)0x0;
      *(CommandType **)&pCVar15[0x3b].type = &pCVar15[0x3a].type;
      pCVar15[0x3c]._vptr_Command = (_func_int **)&pCVar15[0x3a].type;
      *(undefined8 *)&pCVar15[0x3c].type = 0;
      if ((_Var10._M_head_impl)->type_ != Text) {
        __function = 
        "Derived *wabt::cast(Base *) [Derived = wabt::TextScriptModule, Base = wabt::ScriptModule]";
        goto LAB_00185494;
      }
      this_01 = (Module *)(pCVar15 + 1);
      Module::operator=(this_01,(Module *)(_Var10._M_head_impl + 1));
      pCVar2 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar15;
      if (pCVar2 != (Command *)0x0) {
        (*pCVar2->_vptr_Command[1])();
      }
    }
  }
  EVar17 = Ok;
  if (script != (Script *)0x0) {
    IVar16 = (Index)((ulong)((long)(script->commands).
                                   super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(script->commands).
                                  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if ((this_01->name)._M_string_length != 0) {
      local_58.features._0_4_ = *(undefined4 *)&(this_01->loc).filename._M_len;
      local_58.features._4_4_ = *(undefined4 *)((long)&(this_01->loc).filename._M_len + 4);
      uVar5 = *(undefined4 *)&(this_01->loc).filename._M_str;
      uVar6 = *(undefined4 *)((long)&(this_01->loc).filename._M_str + 4);
      iVar7 = (this_01->loc).field_1.field_0.line;
      local_58._20_4_ = (this_01->loc).field_1.field_0.first_column;
      local_58.log_stream = *(Stream **)((long)&(this_01->loc).field_1 + 8);
      local_58._19_1_ = SUB41((uint)iVar7 >> 0x18,0);
      local_58.features.tail_call_enabled_ = SUB41(uVar5,0);
      local_58.features._9_2_ = SUB42((uint)uVar5 >> 8,0);
      local_58.features._12_3_ = SUB43(uVar6,0);
      local_58.features.annotations_enabled_ = SUB41((uint)uVar5 >> 0x18,0);
      local_58.features.multi_memory_enabled_ = SUB41((uint)uVar6 >> 0x18,0);
      local_58.features._16_3_ = (int3)iVar7;
      local_58._32_4_ = IVar16;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&script->module_bindings,0,&this_01->name);
    }
    this->last_module_index_ = IVar16;
    EVar17 = Ok;
  }
LAB_0018542d:
  if (local_98._M_head_impl != (ScriptModule *)0x0) {
    (*(local_98._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)EVar17;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      if (options_->parse_binary_modules) {
        ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                     &errors, module);
      }
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      auto* qsm = cast<QuotedScriptModule>(script_module.get());
      Errors errors;
      const char* filename = "<text>";
      std::unique_ptr<Module> m;
      std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
          filename, qsm->data.data(), qsm->data.size(), &errors);
      auto result = ParseWatModule(lexer.get(), &m, &errors, options_);
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(qsm->loc, "error in quoted module: %s", error.message.c_str());
        } else {
          Error(qsm->loc, "error in quoted module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      if (Succeeded(result)) {
        *module = std::move(*m.get());
      }
      *out_command = std::move(command);
      break;
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}